

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLUPSIDEGAP2CROWS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000238;
  double *in_stack_00000240;
  double *in_stack_00000248;
  double *in_stack_00000250;
  int in_stack_0000025c;
  int in_stack_00000260;
  int *in_stack_00000270;
  int *in_stack_00000278;
  int *in_stack_00000280;
  
  TVar1 = TA_CDLUPSIDEGAP2CROWS
                    (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248,
                     in_stack_00000240,in_stack_00000238,in_stack_00000270,in_stack_00000278,
                     in_stack_00000280);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLUPSIDEGAP2CROWS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLUPSIDEGAP2CROWS(
/* Generated */                            startIdx,
/* Generated */                            endIdx,
/* Generated */                            params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                            params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                            params->in[0].data.inPrice.low, /* inLow */
/* Generated */                            params->in[0].data.inPrice.close, /* inClose */
/* Generated */                            outBegIdx, 
/* Generated */                            outNBElement, 
/* Generated */                            params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }